

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double find_split_std_gain_weighted<double,double>
                 (double *x,size_t n,double *sd_arr,GainCriterion criterion,double min_gain,
                 double *split_point,double *w,size_t *sorted_ix)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double cumw;
  double local_38;
  
  dVar6 = calc_sd_right_to_left_weighted<double,double>(x,n,sd_arr,w,&local_38,sorted_ix);
  if (n == 1) {
    dVar12 = -INFINITY;
  }
  else {
    sVar5 = *sorted_ix;
    dVar12 = -INFINITY;
    dVar8 = 0.0;
    lVar3 = 0;
    lVar4 = 0;
    dVar10 = 0.0;
    dVar9 = 0.0;
    dVar11 = x[sVar5];
    dVar7 = x[sVar5];
    do {
      dVar1 = w[sVar5];
      dVar8 = dVar8 + dVar1;
      sVar5 = sorted_ix[lVar3 + 1];
      dVar2 = x[sVar5];
      dVar10 = ((dVar11 - dVar10) * dVar1) / dVar8 + dVar10;
      dVar9 = (dVar11 - dVar7) * (dVar11 - dVar10) * dVar1 + dVar9;
      if ((dVar11 != dVar2) || (NAN(dVar11) || NAN(dVar2))) {
        dVar11 = 0.0;
        if (lVar3 != 0) {
          dVar11 = SQRT(dVar9 / dVar8);
        }
        if (criterion == Pooled) {
          dVar11 = ((dVar8 / local_38) * dVar11 +
                   ((local_38 - dVar8) / local_38) * sd_arr[lVar3 + 1]) * (-1.0 / dVar6) + 1.0;
        }
        else {
          dVar11 = 1.0 - (dVar11 + sd_arr[lVar3 + 1]) / (dVar6 + dVar6);
        }
        if ((dVar12 < dVar11) && (min_gain < dVar11)) {
          lVar4 = lVar3;
          dVar12 = dVar11;
        }
      }
      lVar3 = lVar3 + 1;
      dVar11 = dVar2;
      dVar7 = dVar10;
    } while (n - 1 != lVar3);
    if (dVar12 != -INFINITY) {
      dVar6 = x[sorted_ix[lVar4]];
      dVar11 = x[sorted_ix[lVar4 + 1]];
      dVar7 = (dVar11 - dVar6) * 0.5 + dVar6;
      if (dVar11 <= dVar7) {
        dVar7 = nextafter(dVar7,dVar11);
        if ((dVar7 <= dVar6) || (dVar11 <= dVar7)) {
          dVar7 = dVar6;
        }
      }
      *split_point = dVar7;
    }
  }
  return dVar12;
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, size_t n, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point,
                                    double *restrict w, size_t *restrict sorted_ix)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, n, sd_arr, w, cumw, sorted_ix);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[sorted_ix[0]];
    double best_gain = -HUGE_VAL;
    double this_sd, this_gain;
    double w_this;
    ldouble_safe currw = 0;
    size_t best_ix = 0;

    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[sorted_ix[row]];
        currw += w_this;
        running_mean   += w_this * (x[sorted_ix[row]] - running_mean) / currw;
        running_ssq    += w_this * ((x[sorted_ix[row]] - running_mean) * (x[sorted_ix[row]] - mean_prev));
        mean_prev       =  running_mean;
        if (x[sorted_ix[row]] == x[sorted_ix[row+1]])
            continue;

        this_sd = (row == 0)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            best_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[sorted_ix[best_ix]], x[sorted_ix[best_ix+1]]);

    return best_gain;
}